

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::InternalSwap
          (UniDirectionalLSTMLayerParams *this,UniDirectionalLSTMLayerParams *other)

{
  bool bVar1;
  int iVar2;
  LSTMParams *pLVar3;
  LSTMWeightParams *pLVar4;
  uint64 uVar5;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activations_).super_RepeatedPtrFieldBase,
             &(other->activations_).super_RepeatedPtrFieldBase);
  pLVar3 = this->params_;
  this->params_ = other->params_;
  other->params_ = pLVar3;
  pLVar4 = this->weightparams_;
  this->weightparams_ = other->weightparams_;
  other->weightparams_ = pLVar4;
  uVar5 = this->inputvectorsize_;
  this->inputvectorsize_ = other->inputvectorsize_;
  other->inputvectorsize_ = uVar5;
  uVar5 = this->outputvectorsize_;
  this->outputvectorsize_ = other->outputvectorsize_;
  other->outputvectorsize_ = uVar5;
  bVar1 = this->reverseinput_;
  this->reverseinput_ = other->reverseinput_;
  other->reverseinput_ = bVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::InternalSwap(UniDirectionalLSTMLayerParams* other) {
  activations_.InternalSwap(&other->activations_);
  std::swap(params_, other->params_);
  std::swap(weightparams_, other->weightparams_);
  std::swap(inputvectorsize_, other->inputvectorsize_);
  std::swap(outputvectorsize_, other->outputvectorsize_);
  std::swap(reverseinput_, other->reverseinput_);
  std::swap(_cached_size_, other->_cached_size_);
}